

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

Expr tail(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
         int argc)

{
  char *__s;
  Expr EVar1;
  Expr EVar2;
  
  if (argc == 1) {
    EVar1._4_4_ = 0;
    EVar1.type = args->type;
    EVar1.field_1.val_atom = (args->field_1).val_atom;
    EVar1 = exec_eval(exec,callContext,EVar1);
    if (EVar1.type == VT_PAIR) {
      EVar2._4_4_ = 0;
      EVar2.type = exec->cdrs[EVar1.field_1.val_atom].type;
      EVar2.field_1.val_atom = exec->cdrs[EVar1.field_1.val_atom].field_1.val_atom;
      return EVar2;
    }
    __s = "tail: argument not a pair";
  }
  else {
    __s = "tail: wrong arguments count";
  }
  puts(__s);
  exit(1);
}

Assistant:

BUILTIN_FUNC(tail)
{
    if (argc != 1)
    {
        log("tail: wrong arguments count");
        exit(1);
    }
    Expr arg = exec_eval(exec, callContext, args[0]);
    if (arg.type != VT_PAIR)
    {
        log("tail: argument not a pair");
        exit(1);
    }
    return exec->cdrs[arg.val_pair];
}